

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void anon_unknown.dwarf_5a8582::ArchiveError(char *m1,archive *a)

{
  char *pcVar1;
  string message;
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,m1,&local_29);
  pcVar1 = archive_error_string(a);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::append((char *)&local_28);
  }
  cmSystemTools::Error(&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ArchiveError(const char* m1, struct archive* a)
{
  std::string message(m1);
  const char* m2 = archive_error_string(a);
  if (m2) {
    message += m2;
  }
  cmSystemTools::Error(message);
}